

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O1

Field * __thiscall
capnp::StructSchema::getFieldByName(Field *__return_storage_ptr__,StructSchema *this,StringPtr name)

{
  StringPtr name_local;
  Fault f;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::StructSchema::Field>_2 local_98 [2];
  
  name_local.content.size_ = name.content.size_;
  name_local.content.ptr = name.content.ptr;
  findFieldByName((Maybe<capnp::StructSchema::Field> *)&f,this,name);
  if ((char)f.exception == '\x01') {
    (__return_storage_ptr__->proto)._reader.dataSize = local_98[0]._48_4_;
    (__return_storage_ptr__->proto)._reader.pointerCount = local_98[0]._52_2_;
    *(undefined2 *)&(__return_storage_ptr__->proto)._reader.field_0x26 = local_98[0]._54_2_;
    *(undefined8 *)&(__return_storage_ptr__->proto)._reader.nestingLimit = local_98[0]._56_8_;
    (__return_storage_ptr__->proto)._reader.data = (void *)local_98[0]._32_8_;
    (__return_storage_ptr__->proto)._reader.pointers = (WirePointer *)local_98[0]._40_8_;
    (__return_storage_ptr__->proto)._reader.segment = (SegmentReader *)local_98[0]._16_8_;
    (__return_storage_ptr__->proto)._reader.capTable = (CapTableReader *)local_98[0]._24_8_;
    (__return_storage_ptr__->parent).super_Schema.raw = (RawBrandedSchema *)local_98[0]._0_8_;
    *(undefined8 *)&__return_storage_ptr__->index = local_98[0]._8_8_;
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[26],kj::StringPtr&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.c++"
             ,0x1ff,FAILED,(char *)0x0,"\"struct has no such member\", name",
             (char (*) [26])"struct has no such member",&name_local);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

StructSchema::Field StructSchema::getFieldByName(kj::StringPtr name) const {
  KJ_IF_SOME(member, findFieldByName(name)) {
    return member;
  } else {
    KJ_FAIL_REQUIRE("struct has no such member", name);
  }